

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void PPC_printInst(MCInst *MI,SStream *O,void *Info)

{
  cs_detail *pcVar1;
  bool bVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  MCOperand *pMVar7;
  int64_t iVar8;
  int64_t iVar9;
  uint8_t *puVar10;
  ulong uVar11;
  uint64_t uVar12;
  size_t sVar13;
  undefined1 local_68 [8];
  ppc_alias alias;
  int64_t bd_2;
  int64_t bd_1;
  int64_t bd;
  uchar ME_1;
  uchar SH_1;
  cs_ppc *ppc;
  _Bool useSubstituteMnemonic;
  uchar ME;
  uchar MB;
  char *pcStack_28;
  uchar SH;
  char *mnem;
  void *Info_local;
  SStream *O_local;
  MCInst *MI_local;
  
  uVar4 = MCInst_getOpcode(MI);
  if (uVar4 == 0x311) {
    pMVar7 = MCInst_getOperand(MI,2);
    iVar8 = MCOperand_getImm(pMVar7);
    ppc._7_1_ = (byte)iVar8;
    pMVar7 = MCInst_getOperand(MI,3);
    iVar8 = MCOperand_getImm(pMVar7);
    pMVar7 = MCInst_getOperand(MI,4);
    iVar9 = MCOperand_getImm(pMVar7);
    bVar2 = false;
    if (((ppc._7_1_ < 0x20) && ((byte)iVar8 == 0)) && ((uint)(byte)iVar9 == 0x1f - ppc._7_1_)) {
      SStream_concat0(O,"slwi\t");
      MCInst_setOpcodePub(MI,0x301);
      bVar2 = true;
    }
    if (((ppc._7_1_ < 0x20) && ((uint)(byte)iVar8 == 0x20 - ppc._7_1_)) && ((byte)iVar9 == 0x1f)) {
      SStream_concat0(O,"srwi\t");
      MCInst_setOpcodePub(MI,0x302);
      bVar2 = true;
      ppc._7_1_ = 0x20 - ppc._7_1_;
    }
    if (bVar2) {
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      if (ppc._7_1_ < 10) {
        SStream_concat(O,", %u",(ulong)ppc._7_1_);
      }
      else {
        SStream_concat(O,", 0x%x",(ulong)ppc._7_1_);
      }
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar1 = MI->flat_insn->detail;
      puVar10 = pcVar1->groups + (ulong)(pcVar1->field_6).x86.addr_size * 0x10 + 0x1a;
      puVar10[0] = '\x02';
      puVar10[1] = '\0';
      puVar10[2] = '\0';
      puVar10[3] = '\0';
      *(uint *)(pcVar1->groups + (ulong)(pcVar1->field_6).x86.addr_size * 0x10 + 0x1e) =
           (uint)ppc._7_1_;
      (pcVar1->field_6).x86.addr_size = (pcVar1->field_6).x86.addr_size + '\x01';
      return;
    }
  }
  uVar4 = MCInst_getOpcode(MI);
  if ((uVar4 == 0x2e8) || (uVar4 = MCInst_getOpcode(MI), uVar4 == 0x2e9)) {
    pMVar7 = MCInst_getOperand(MI,1);
    uVar4 = MCOperand_getReg(pMVar7);
    pMVar7 = MCInst_getOperand(MI,2);
    uVar5 = MCOperand_getReg(pMVar7);
    if (uVar4 == uVar5) {
      SStream_concat0(O,"mr\t");
      MCInst_setOpcodePub(MI,0x34c);
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      return;
    }
  }
  uVar4 = MCInst_getOpcode(MI);
  if (uVar4 == 0x308) {
    pMVar7 = MCInst_getOperand(MI,2);
    uVar11 = MCOperand_getImm(pMVar7);
    pMVar7 = MCInst_getOperand(MI,3);
    iVar8 = MCOperand_getImm(pMVar7);
    if (0x3f - (byte)uVar11 == (uint)(byte)iVar8) {
      SStream_concat0(O,"sldi\t");
      MCInst_setOpcodePub(MI,0x303);
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      if (9 < (byte)uVar11) {
        SStream_concat(O,", 0x%x",uVar11 & 0xff);
        return;
      }
      SStream_concat(O,", %u",uVar11 & 0xff);
      return;
    }
  }
  uVar4 = MCInst_getOpcode(MI);
  if ((((uVar4 == 0x4ed) || (uVar4 = MCInst_getOpcode(MI), uVar4 == 0x4ee)) ||
      (uVar4 = MCInst_getOpcode(MI), uVar4 == 0x4f1)) ||
     (uVar4 = MCInst_getOpcode(MI), uVar4 == 0x4f2)) {
    pMVar7 = MCInst_getOperand(MI,2);
    uVar12 = MCOperand_getImm(pMVar7);
    iVar8 = SignExtend64(uVar12,0xe);
    pMVar7 = MCInst_getOperand(MI,2);
    MCOperand_setImm(pMVar7,iVar8);
  }
  uVar4 = MCInst_getOpcode(MI);
  iVar6 = isBOCTRBranch(uVar4);
  if (iVar6 != 0) {
    pMVar7 = MCInst_getOperand(MI,0);
    _Var3 = MCOperand_isImm(pMVar7);
    if (_Var3) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar12 = MCOperand_getImm(pMVar7);
      iVar8 = SignExtend64(uVar12,0xe);
      pMVar7 = MCInst_getOperand(MI,0);
      MCOperand_setImm(pMVar7,iVar8);
    }
  }
  uVar4 = MCInst_getOpcode(MI);
  if (((uVar4 == 0x71) || (uVar4 = MCInst_getOpcode(MI), uVar4 == 0x72)) ||
     ((uVar4 = MCInst_getOpcode(MI), uVar4 == 0xba || (uVar4 = MCInst_getOpcode(MI), uVar4 == 0xc0))
     )) {
    pMVar7 = MCInst_getOperand(MI,0);
    alias.mnem = (char *)MCOperand_getImm(pMVar7);
    alias.mnem = (char *)SignExtend64((uint64_t)alias.mnem,0x18);
    pMVar7 = MCInst_getOperand(MI,0);
    MCOperand_setImm(pMVar7,(int64_t)alias.mnem);
  }
  pcStack_28 = printAliasInstrEx(MI,O,Info);
  if (pcStack_28 == (char *)0x0) {
    pcStack_28 = printAliasInstr(MI,O,Info);
  }
  if (pcStack_28 == (char *)0x0) {
    printInstruction(MI,O,(MCRegisterInfo *)0x0);
  }
  else {
    sVar13 = strlen(pcStack_28);
    if (sVar13 != 0) {
      sVar13 = strlen(pcStack_28);
      if (((pcStack_28[sVar13 - 1] == '-') ||
          (sVar13 = strlen(pcStack_28), pcStack_28[sVar13 - 1] == '+')) ||
         (sVar13 = strlen(pcStack_28), pcStack_28[sVar13 - 1] == '.')) {
        sVar13 = strlen(pcStack_28);
        pcStack_28[sVar13 - 1] = '\0';
      }
      _Var3 = PPC_alias_insn(pcStack_28,(ppc_alias *)local_68);
      if ((_Var3) && (MCInst_setOpcodePub(MI,local_68._0_4_), MI->csh->detail != CS_OPT_OFF)) {
        *(undefined4 *)(MI->flat_insn->detail->field_6).x86.prefix = local_68._4_4_;
      }
    }
    (*cs_mem_free)(pcStack_28);
  }
  return;
}

Assistant:

void PPC_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem;

	// Check for slwi/srwi mnemonics.
	if (MCInst_getOpcode(MI) == PPC_RLWINM) {
		unsigned char SH = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 2));
		unsigned char MB = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 3));
		unsigned char ME = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 4));
		bool useSubstituteMnemonic = false;

		if (SH <= 31 && MB == 0 && ME == (31-SH)) {
			SStream_concat0(O, "slwi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SLWI);
			useSubstituteMnemonic = true;
		}

		if (SH <= 31 && MB == (32-SH) && ME == 31) {
			SStream_concat0(O, "srwi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SRWI);
			useSubstituteMnemonic = true;
			SH = 32-SH;
		}

		if (useSubstituteMnemonic) {
			printOperand(MI, 0, O);
			SStream_concat0(O, ", ");
			printOperand(MI, 1, O);
			if (SH > HEX_THRESHOLD)
				SStream_concat(O, ", 0x%x", (unsigned int)SH);
			else
				SStream_concat(O, ", %u", (unsigned int)SH);

			if (MI->csh->detail) {
				cs_ppc *ppc = &MI->flat_insn->detail->ppc;

				ppc->operands[ppc->op_count].type = PPC_OP_IMM;
				ppc->operands[ppc->op_count].imm = SH;
				++ppc->op_count;
			}

			return;
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_OR || MCInst_getOpcode(MI) == PPC_OR8) &&
			MCOperand_getReg(MCInst_getOperand(MI, 1)) == MCOperand_getReg(MCInst_getOperand(MI, 2))) {
		SStream_concat0(O, "mr\t");
		MCInst_setOpcodePub(MI, PPC_INS_MR);
		printOperand(MI, 0, O);
		SStream_concat0(O, ", ");
		printOperand(MI, 1, O);
		return;
	}

	if (MCInst_getOpcode(MI) == PPC_RLDICR) {
		unsigned char SH = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 2));
		unsigned char ME = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 3));
		// rldicr RA, RS, SH, 63-SH == sldi RA, RS, SH
		if (63-SH == ME) {
			SStream_concat0(O, "sldi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SLDI);
			printOperand(MI, 0, O);
			SStream_concat0(O, ", ");
			printOperand(MI, 1, O);
			if (SH > HEX_THRESHOLD)
				SStream_concat(O, ", 0x%x", (unsigned int)SH);
			else
				SStream_concat(O, ", %u", (unsigned int)SH);

			return;
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_gBC)||(MCInst_getOpcode(MI) == PPC_gBCA)||
			(MCInst_getOpcode(MI) == PPC_gBCL)||(MCInst_getOpcode(MI) == PPC_gBCLA)) {
		int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 2));
		bd = SignExtend64(bd, 14);
		MCOperand_setImm(MCInst_getOperand(MI, 2),bd);
	}

	if (isBOCTRBranch(MCInst_getOpcode(MI))) {
		if (MCOperand_isImm(MCInst_getOperand(MI,0)))
		{
			int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 0));
			bd = SignExtend64(bd, 14);
			MCOperand_setImm(MCInst_getOperand(MI, 0),bd);
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_B)||(MCInst_getOpcode(MI) == PPC_BA)||
			(MCInst_getOpcode(MI) == PPC_BL)||(MCInst_getOpcode(MI) == PPC_BLA)) {
		int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 0));
		bd = SignExtend64(bd, 24);
		MCOperand_setImm(MCInst_getOperand(MI, 0),bd);
	}

	// consider our own alias instructions first
	mnem = printAliasInstrEx(MI, O, Info);
	if (!mnem)
		mnem = printAliasInstr(MI, O, Info);

	if (mnem != NULL) {
		if (strlen(mnem) > 0) {
			struct ppc_alias alias;
			// check to remove the last letter of ('.', '-', '+')
			if (mnem[strlen(mnem) - 1] == '-' || mnem[strlen(mnem) - 1] == '+' || mnem[strlen(mnem) - 1] == '.')
				mnem[strlen(mnem) - 1] = '\0';

			if (PPC_alias_insn(mnem, &alias)) {
				MCInst_setOpcodePub(MI, alias.id);
				if (MI->csh->detail) {
					MI->flat_insn->detail->ppc.bc = (ppc_bc)alias.cc;
				}
			}
		}

		cs_mem_free(mnem);
	} else
		printInstruction(MI, O, NULL);
}